

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  lua_CFunction p_Var1;
  Value *pVVar2;
  UpVal *uv;
  Value VVar3;
  int iVar4;
  TValue *pTVar5;
  char *name;
  ZIO z;
  
  name = "?";
  if (chunkname != (char *)0x0) {
    name = chunkname;
  }
  luaZ_init(L,&z,reader,data);
  iVar4 = luaD_protectedparser(L,&z,name,mode);
  if ((iVar4 == 0) && (p_Var1 = L->top[-1].value_.f, p_Var1[10] != (_func_int_lua_State_ptr)0x0)) {
    pTVar5 = luaH_getint((Table *)(L->l_G->l_registry).value_.gc,2);
    pVVar2 = (Value *)**(long **)(p_Var1 + 0x20);
    VVar3 = *(Value *)&pTVar5->tt_;
    *pVVar2 = pTVar5->value_;
    pVVar2[1] = VVar3;
    uv = *(UpVal **)(p_Var1 + 0x20);
    if ((uv->v == (TValue *)&uv->u & (byte)uv->v->tt_ >> 6) == 1) {
      luaC_upvalbarrier_(L,uv);
    }
  }
  return iVar4;
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    LClosure *f = clLvalue(L->top - 1);  /* get newly created function */
    if (f->nupvalues >= 1) {  /* does it have an upvalue? */
      /* get global table from registry */
      Table *reg = hvalue(&G(L)->l_registry);
      const TValue *gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
      /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
      setobj(L, f->upvals[0]->v, gt);
      luaC_upvalbarrier(L, f->upvals[0]);
    }
  }
  lua_unlock(L);
  return status;
}